

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O3

void * hashmap_delete_with_hash(hashmap *map,void *key,uint64_t hash)

{
  ulong *puVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  void *pvVar5;
  size_t __n;
  ulong uVar6;
  ulong uVar7;
  ulong *__src;
  ulong *__dest;
  
  map->oom = false;
  sVar3 = map->bucketsz;
  uVar7 = map->mask;
  uVar6 = uVar7 & hash & 0xffffffffffff;
  pvVar5 = map->buckets;
  uVar4 = *(ulong *)((long)pvVar5 + sVar3 * uVar6);
  if (0xffffffffffff < uVar4) {
    __src = (ulong *)(sVar3 * uVar6 + (long)pvVar5);
    do {
      if ((uVar4 & 0xffffffffffff) == (hash & 0xffffffffffff)) {
        if ((map->compare == (_func_int_void_ptr_void_ptr_void_ptr *)0x0) ||
           (iVar2 = (*map->compare)(key,__src + 1,map->udata), iVar2 == 0)) {
          memcpy(map->spare,__src + 1,map->elsize);
          uVar4 = *__src & 0xffffffffffff;
          *__src = uVar4;
          uVar7 = uVar6 + 1 & map->mask;
          __n = map->bucketsz;
          if (*(ulong *)((long)map->buckets + uVar7 * __n) >> 0x31 != 0) {
            puVar1 = (ulong *)((long)map->buckets + uVar7 * __n);
            __dest = __src;
            do {
              __src = puVar1;
              memcpy(__dest,__src,__n);
              *__dest = *__dest & 0xffffffffffff | (*__dest & 0xffff000000000000) - 0x1000000000000;
              uVar7 = uVar7 + 1 & map->mask;
              __n = map->bucketsz;
              puVar1 = (ulong *)((long)map->buckets + uVar7 * __n);
              __dest = __src;
            } while (0x1ffffffffffff < *(ulong *)((long)map->buckets + uVar7 * __n));
            uVar4 = *__src & 0xffffffffffff;
          }
          *__src = uVar4;
          uVar4 = map->count - 1;
          map->count = uVar4;
          if ((map->cap < map->nbuckets) && (uVar4 <= map->shrinkat)) {
            resize(map,map->nbuckets >> 1);
          }
          return map->spare;
        }
        sVar3 = map->bucketsz;
        uVar7 = map->mask;
        pvVar5 = map->buckets;
      }
      uVar6 = uVar6 + 1 & uVar7;
      __src = (ulong *)((long)pvVar5 + sVar3 * uVar6);
      uVar4 = *(ulong *)((long)pvVar5 + sVar3 * uVar6);
    } while (0xffffffffffff < uVar4);
  }
  return (void *)0x0;
}

Assistant:

const void *hashmap_delete_with_hash(struct hashmap *map, const void *key,
    uint64_t hash)
{
    hash = clip_hash(hash);
    map->oom = false;
    size_t i = hash & map->mask;
    while(1) {
        struct bucket *bucket = bucket_at(map, i);
        if (!bucket->dib) {
            return NULL;
        }
        void *bitem = bucket_item(bucket);
        if (bucket->hash == hash && (!map->compare ||
            map->compare(key, bitem, map->udata) == 0))
        {
            memcpy(map->spare, bitem, map->elsize);
            bucket->dib = 0;
            while(1) {
                struct bucket *prev = bucket;
                i = (i + 1) & map->mask;
                bucket = bucket_at(map, i);
                if (bucket->dib <= 1) {
                    prev->dib = 0;
                    break;
                }
                memcpy(prev, bucket, map->bucketsz);
                prev->dib--;
            }
            map->count--;
            if (map->nbuckets > map->cap && map->count <= map->shrinkat) {
                // Ignore the return value. It's ok for the resize operation to
                // fail to allocate enough memory because a shrink operation
                // does not change the integrity of the data.
                resize(map, map->nbuckets/2);
            }
            return map->spare;
        }
        i = (i + 1) & map->mask;
    }
}